

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_uuid.cpp
# Opt level: O3

ON_wString ON_RemoveIdSuffixFromString(wchar_t *source,wchar_t *separator,ON_UUID id)

{
  ON_Locale *locale;
  ON_wString suffix;
  ON_wString s;
  ON_UUID in_stack_ffffffffffffffc8;
  ON_wString local_28;
  
  ON_wString::ON_wString(&local_28,separator);
  ON_wString::ON_wString((ON_wString *)&stack0xffffffffffffffc8,id._0_8_);
  ON_IdToString(in_stack_ffffffffffffffc8);
  ON_wString::operator+=
            ((ON_wString *)&stack0xffffffffffffffc8,(ON_wString *)&stack0xffffffffffffffd0);
  ON_wString::~ON_wString((ON_wString *)&stack0xffffffffffffffd0);
  locale = (ON_Locale *)
           ON_wString::operator_cast_to_wchar_t_((ON_wString *)&stack0xffffffffffffffc8);
  ON_wString::RemoveSuffix((ON_wString *)source,(wchar_t *)&local_28,locale,true);
  ON_wString::~ON_wString((ON_wString *)&stack0xffffffffffffffc8);
  ON_wString::~ON_wString(&local_28);
  return (ON_wString)source;
}

Assistant:

ON_DECL
const ON_wString ON_RemoveIdSuffixFromString(
  const wchar_t* source,
  const wchar_t* separator,
  const ON_UUID id
)
{
  ON_wString s(source);
  ON_wString suffix(separator);
  suffix += ON_IdToString(id);
  return s.RemoveSuffix(suffix,ON_Locale::Ordinal,true);
}